

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetEffectiveFolderName_abi_cxx11_
          (string *__return_storage_ptr__,cmGeneratorTarget *this)

{
  int iVar1;
  cmValue cVar2;
  allocator<char> local_31;
  string local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar1 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x2c])();
  if ((char)iVar1 != '\0') {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"FOLDER",&local_31);
    cVar2 = GetProperty(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    if (cVar2.Value != (string *)0x0) {
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetEffectiveFolderName() const
{
  std::string effectiveFolder;

  if (!this->GlobalGenerator->UseFolderProperty()) {
    return effectiveFolder;
  }

  cmValue targetFolder = this->GetProperty("FOLDER");
  if (targetFolder) {
    effectiveFolder += *targetFolder;
  }

  return effectiveFolder;
}